

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98d_device.c
# Opt level: O2

int read_devices(s98context *ctx)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  s98deviceinfo *psVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong __nmemb;
  int local_3c;
  ulong local_38;
  
  iVar1 = (ctx->header).version;
  if (iVar1 == 2) {
    ctx->devices = (s98deviceinfo *)0x0;
    local_38 = 0;
    lVar8 = 0xc;
    local_3c = 0;
    while( true ) {
      uVar2 = read_dword(ctx);
      uVar3 = read_dword(ctx);
      uVar4 = read_dword(ctx);
      uVar5 = read_dword(ctx);
      if (uVar2 == 0) break;
      psVar6 = ctx->devices;
      if (local_3c <= (int)((uint32_t)local_38 + 1)) {
        lVar7 = (long)local_3c;
        local_3c = local_3c + 4;
        psVar6 = (s98deviceinfo *)realloc(psVar6,lVar7 * 0x10 + 0x40);
        ctx->devices = psVar6;
      }
      *(uint32_t *)((long)psVar6 + lVar8 + -0xc) = uVar2;
      *(uint32_t *)((long)psVar6 + lVar8 + -8) = uVar3;
      *(uint32_t *)((long)psVar6 + lVar8 + -4) = uVar4;
      *(uint32_t *)((long)&psVar6->device + lVar8) = uVar5;
      lVar8 = lVar8 + 0x10;
      local_38 = local_38 + 1;
    }
    if (local_38 == 0) goto LAB_0010174d;
    psVar6 = (s98deviceinfo *)realloc(ctx->devices,local_38 & 0xffffffff);
    ctx->devices = psVar6;
    (ctx->header).device_count = (uint32_t)local_38;
    iVar1 = (ctx->header).version;
  }
  else if (iVar1 == 1) {
    ctx->devices = &default_opna;
    return 0;
  }
  if (iVar1 != 3) {
    return 0;
  }
  __nmemb = (ulong)(ctx->header).device_count;
  if (__nmemb != 0) {
    lVar8 = 0xc;
    psVar6 = (s98deviceinfo *)calloc(__nmemb,0x10);
    ctx->devices = psVar6;
    for (uVar9 = 0; uVar9 < __nmemb; uVar9 = uVar9 + 1) {
      uVar2 = read_dword(ctx);
      uVar3 = read_dword(ctx);
      uVar4 = read_dword(ctx);
      uVar5 = read_dword(ctx);
      psVar6 = ctx->devices;
      *(uint32_t *)((long)psVar6 + lVar8 + -0xc) = uVar2;
      *(uint32_t *)((long)psVar6 + lVar8 + -8) = uVar3;
      *(uint32_t *)((long)psVar6 + lVar8 + -4) = uVar4;
      *(uint32_t *)((long)&psVar6->device + lVar8) = uVar5;
      __nmemb = (ulong)(ctx->header).device_count;
      lVar8 = lVar8 + 0x10;
    }
    return 0;
  }
LAB_0010174d:
  ctx->devices = &default_opna;
  (ctx->header).device_count = 1;
  return 0;
}

Assistant:

int read_devices(struct s98context* ctx)
{
    if(ctx->header.version == 1) {
        ctx->devices = &default_opna;
        return 0;
    }

    if(ctx->header.version == 2) {
        int devices_allocated = 0;
        int devices = 0;

        ctx->devices = NULL;

        for(;;) {
            struct s98deviceinfo info;
            
            info.device = read_dword(ctx);
            info.clock = read_dword(ctx);
            info.panpot = read_dword(ctx);
            info.reserved = read_dword(ctx);

            if(info.device == s98NONE) break;

            if(devices + 1 >= devices_allocated)  {
                devices_allocated += 4;
                ctx->devices = realloc(ctx->devices, devices_allocated * sizeof(struct s98deviceinfo));
            }
            ctx->devices[devices] = info;
            devices++;
        }
        if(devices == 0) {
            ctx->devices = &default_opna;
            ctx->header.device_count = 1;
            return 0;
        } else {
            ctx->devices = realloc(ctx->devices, devices);
            ctx->header.device_count = devices;
        }
    }
    if(ctx->header.version == 3) {
        if(ctx->header.device_count == 0) {
            ctx->devices = &default_opna;
            ctx->header.device_count = 1;
            return 0;
        }

        int devices;

        ctx->devices = calloc(ctx->header.device_count, sizeof(struct s98deviceinfo));

        for(devices = 0; devices < ctx->header.device_count; devices++) {
            struct s98deviceinfo info;

            info.device = read_dword(ctx);
            info.clock = read_dword(ctx);
            info.panpot = read_dword(ctx);
            info.reserved = read_dword(ctx);

            ctx->devices[devices] = info;
        }
    }
    return 0;
}